

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::strTree<char_const(&)[4],kj::Vector<char>&,char>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [4],Vector<char> *params_1,
          char *params_2)

{
  undefined1 local_39 [9];
  long local_30;
  ArrayPtr<const_char> local_28;
  
  local_28 = toCharSequence<char_const(&)[4]>((char (*) [4])this);
  local_39._1_8_ = *(undefined8 *)params;
  local_30 = *(long *)(params + 2) - local_39._1_8_;
  local_39[0] = *(undefined1 *)&(params_1->builder).ptr;
  StringTree::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(StringTree *)&local_28,(ArrayPtr<const_char> *)(local_39 + 1),
             (ArrayPtr<const_char> *)local_39,(FixedArray<char,_1UL> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}